

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O3

int Sim_SymmsIsCompatibleWithNodes(Abc_Ntk_t *pNtk,uint uSymm,Vec_Ptr_t *vNodesOther,int *pMap)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  if ((long)vNodesOther->nSize < 1) {
    return 1;
  }
  lVar5 = 0;
  do {
    uVar4 = (ulong)vNodesOther->pArray[lVar5] & 0xfffffffffffffffe;
    pvVar2 = pNtk->vSupps->pArray[*(int *)(uVar4 + 0x10)];
    uVar6 = *(uint *)((long)pvVar2 + (ulong)(uSymm >> 5 & 0x7ff) * 4) & 1 << ((byte)uSymm & 0x1f);
    uVar7 = *(uint *)((long)pvVar2 + (ulong)(uSymm >> 0x15) * 4) &
            1 << ((byte)(uSymm >> 0x10) & 0x1f);
    if (uVar6 != 0 || uVar7 != 0) {
      if ((uVar6 != 0) != (uVar7 != 0)) {
        return 0;
      }
      lVar3 = *(long *)(uVar4 + 0x40);
      iVar1 = *(int *)(lVar3 + 4);
      lVar8 = 0;
      if (0 < (long)iVar1) {
        lVar8 = 0;
        while (*(uint *)(*(long *)(lVar3 + 8) + lVar8 * 4) != uSymm) {
          lVar8 = lVar8 + 1;
          if (iVar1 == lVar8) {
            return 0;
          }
        }
      }
      if ((int)lVar8 == iVar1) {
        return 0;
      }
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == vNodesOther->nSize) {
      return 1;
    }
  } while( true );
}

Assistant:

int Sim_SymmsIsCompatibleWithNodes( Abc_Ntk_t * pNtk, unsigned uSymm, Vec_Ptr_t * vNodesOther, int * pMap )
{
    Vec_Int_t * vSymmsNode;
    Abc_Obj_t * pNode;
    int i, s, Ind1, Ind2, fIsVar1, fIsVar2;

    if ( vNodesOther->nSize == 0 )
        return 1;

    // get the indices of the PI variables
    Ind1 = (uSymm & 0xffff);
    Ind2 = (uSymm >> 16);

    // go through the nodes
    // if they do not belong to a support, it is okay
    // if one belongs, the other does not belong, quit
    // if they belong, but are not part of symmetry, quit
    for ( i = 0; i < vNodesOther->nSize; i++ )
    {
        pNode = Abc_ObjRegular((Abc_Obj_t *)vNodesOther->pArray[i]);
        fIsVar1 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind1 );
        fIsVar2 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind2 );

        if ( !fIsVar1 && !fIsVar2 )
            continue;
        if ( fIsVar1 ^ fIsVar2 )
            return 0;
        // both belong
        // check if there is a symmetry
        vSymmsNode = SIM_READ_SYMMS( pNode );
        for ( s = 0; s < vSymmsNode->nSize; s++ )
            if ( uSymm == (unsigned)vSymmsNode->pArray[s] )
                break;
        if ( s == vSymmsNode->nSize )
            return 0;
    }
    return 1;
}